

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O2

void skiwi::inline_fl_greater(asmcode *code,compiler_options *param_2)

{
  operand oVar1;
  operand local_44;
  operand local_40;
  operand local_3c;
  operation local_38 [2];
  
  local_40 = AH;
  local_44 = RAX;
  local_38[0] = ~CMPLTPD;
  local_38[1] = ~ADD;
  local_3c = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_40,&local_44,&local_3c,(unsigned_long *)local_38);
  local_40 = AH;
  local_44 = RBX;
  local_38[0] = ~CMPLTPD;
  local_38[1] = ~ADD;
  local_3c = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_40,&local_44,&local_3c,(unsigned_long *)local_38);
  local_38[0] = MOVSD;
  local_44 = MEM_RAX;
  local_3c = DH;
  local_40 = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,&local_40,&local_44,(int *)&local_3c);
  local_38[0] = MOVSD;
  oVar1 = XMM1;
  local_44 = MEM_RBX;
  local_3c = DH;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,&local_40,&local_44,(int *)&local_3c);
  local_38[0] = CMPLTPD;
  local_44 = XMM0;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_38,&local_40,&local_44);
  local_38[0] = MOVMSKPD;
  local_44 = oVar1;
  local_40 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_38,&local_40,&local_44);
  local_38[0] = AND;
  oVar1 = NUMBER;
  local_3c = AL;
  local_44 = oVar1;
  local_40 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,&local_40,&local_44,(int *)&local_3c);
  local_38[0] = SHL;
  local_40 = RAX;
  local_3c = BL;
  local_44 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,&local_40,&local_44,(int *)&local_3c);
  local_38[0] = 0x49;
  local_40 = RAX;
  local_3c = DL;
  local_44 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,&local_40,&local_44,(int *)&local_3c);
  return;
}

Assistant:

void inline_fl_greater(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::CMPLTPD, ASM::asmcode::XMM1, ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOVMSKPD, ASM::asmcode::RAX, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::SHL, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 3);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_f);
  }